

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O1

int32_t __thiscall icu_63::UnicodeString::indexOf(UnicodeString *this,char16_t c,int32_t start)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  
  if (start < 0) {
    start = 0;
  }
  else {
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 < start) {
      start = iVar3;
    }
  }
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  iVar2 = doIndexOf(this,c,start,iVar3 - start);
  return iVar2;
}

Assistant:

inline void
UnicodeString::pinIndex(int32_t& start) const
{
  // pin index
  if(start < 0) {
    start = 0;
  } else if(start > length()) {
    start = length();
  }
}